

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O1

int Cec2_ManSweepNode(Cec2_Man_t *p,int iObj)

{
  Gia_Obj_t *pGVar1;
  Gia_Rpr_t *pGVar2;
  long *plVar3;
  uint uVar4;
  Gia_Man_t *pGVar5;
  word *pwVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  Vec_Int_t *pVVar10;
  satoko_stats_t *psVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  Gia_Obj_t *pGVar17;
  uint uVar18;
  timespec ts;
  timespec local_48;
  long local_38;
  
  iVar8 = clock_gettime(3,&local_48);
  if (iVar8 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  if (-1 < iObj) {
    pGVar5 = p->pAig;
    if (iObj < pGVar5->nObjs) {
      uVar13 = (ulong)(uint)pGVar5->pReprs[(uint)iObj] & 0xfffffff;
      if (uVar13 == 0xfffffff) {
        pGVar17 = (Gia_Obj_t *)0x0;
      }
      else {
        if (pGVar5->nObjs <= (int)uVar13) goto LAB_00648879;
        pGVar17 = pGVar5->pObjs + uVar13;
      }
      pGVar1 = pGVar5->pObjs + (uint)iObj;
      uVar15 = pGVar1->Value;
      if (-1 < (int)uVar15) {
        uVar4 = pGVar17->Value;
        local_38 = lVar12;
        if (-1 < (int)uVar4) {
          uVar14 = (uint)((ulong)*(undefined8 *)pGVar1 >> 0x3f) ^ (uVar4 ^ uVar15) & 1;
          uVar18 = -(int)((long)*(undefined8 *)pGVar17 >> 0x3f);
          iVar8 = Cec2_ManSolveTwo(p,uVar4 >> 1,uVar15 >> 1,uVar14 ^ uVar18);
          if (iVar8 == -1) {
            p->nSatUnsat = p->nSatUnsat + 1;
            if ((int)pGVar17->Value < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x132,"int Abc_LitNotCond(int, int)");
            }
            pGVar1->Value = pGVar17->Value ^ (uint)(uVar14 != uVar18);
            pGVar2 = p->pAig->pReprs + (uint)iObj;
            *pGVar2 = (Gia_Rpr_t)((uint)*pGVar2 | 0x10000000);
            iVar8 = clock_gettime(3,&local_48);
            if (iVar8 < 0) {
              lVar12 = -1;
            }
            else {
              lVar12 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
            }
            iVar8 = 1;
            lVar16 = 0x70;
          }
          else if (iVar8 == 1) {
            p->nSatSat = p->nSatSat + 1;
            p->nPatterns = p->nPatterns + 1;
            pGVar5 = p->pAig;
            iVar9 = pGVar5->nSimWords * 0x40;
            iVar8 = 1;
            if (pGVar5->iPatsPi != iVar9 + -1) {
              iVar8 = pGVar5->iPatsPi + 1;
            }
            pGVar5->iPatsPi = iVar8;
            if ((iVar8 < 1) || (iVar9 <= iVar8)) {
              __assert_fail("p->pAig->iPatsPi > 0 && p->pAig->iPatsPi < 64 * p->pAig->nSimWords",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                            ,0x36d,"int Cec2_ManSweepNode(Cec2_Man_t *, int)");
            }
            pVVar10 = p->vObjSatPairs;
            if (1 < pVVar10->nSize) {
              lVar12 = 1;
              do {
                iVar8 = pVVar10->pArray[lVar12 + -1];
                pGVar5 = p->pAig;
                cVar7 = satoko_var_polarity(p->pSat,pVVar10->pArray[lVar12]);
                uVar15 = iVar8 * pGVar5->nSimWords;
                if (((int)uVar15 < 0) || (pGVar5->vSims->nSize <= (int)uVar15)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
                }
                pwVar6 = pGVar5->vSims->pArray;
                lVar16 = (long)(pGVar5->iPatsPi >> 5);
                uVar4 = *(uint *)((long)pwVar6 + lVar16 * 4 + (ulong)uVar15 * 8);
                uVar14 = pGVar5->iPatsPi & 0x1f;
                if (((cVar7 != '\0' ^ (byte)(uVar4 >> (sbyte)uVar14)) & 1) == 0) {
                  *(uint *)((long)pwVar6 + lVar16 * 4 + (ulong)uVar15 * 8) = uVar4 ^ 1 << uVar14;
                }
                pVVar10 = p->vObjSatPairs;
                lVar12 = lVar12 + 2;
              } while ((int)lVar12 < pVVar10->nSize);
            }
            iVar8 = clock_gettime(3,&local_48);
            if (iVar8 < 0) {
              lVar12 = -1;
            }
            else {
              lVar12 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
            }
            iVar8 = 0;
            lVar16 = 0x68;
          }
          else {
            p->nSatUndec = p->nSatUndec + 1;
            if (iVar8 != 0) {
              __assert_fail("status == SATOKO_UNDEC",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                            ,0x37e,"int Cec2_ManSweepNode(Cec2_Man_t *, int)");
            }
            pGVar2 = p->pAig->pReprs + (uint)iObj;
            *pGVar2 = (Gia_Rpr_t)((uint)*pGVar2 | 0x20000000);
            iVar8 = clock_gettime(3,&local_48);
            if (iVar8 < 0) {
              lVar12 = -1;
            }
            else {
              lVar12 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
            }
            iVar8 = 2;
            lVar16 = 0x78;
          }
          plVar3 = (long *)((long)&p->pPars + lVar16);
          *plVar3 = *plVar3 + lVar12 + local_38;
          if (p->pPars->fUseCones == 0) {
            iVar9 = clock_gettime(3,&local_48);
            if (iVar9 < 0) {
              lVar12 = 1;
            }
            else {
              lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
              lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_48.tv_sec * -1000000;
            }
            satoko_rollback(p->pSat);
            iVar9 = clock_gettime(3,&local_48);
            if (iVar9 < 0) {
              lVar16 = -1;
            }
            else {
              lVar16 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
            }
            p->timeExtra = p->timeExtra + lVar16 + lVar12;
            psVar11 = satoko_stats(p->pSat);
            psVar11->n_conflicts = 0;
          }
          return iVar8;
        }
      }
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x130,"int Abc_LitIsCompl(int)");
    }
  }
LAB_00648879:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

int Cec2_ManSweepNode( Cec2_Man_t * p, int iObj )
{
    abctime clk = Abc_Clock();
    int i, IdAig, IdSat, status, RetValue = 1;
    Gia_Obj_t * pObj = Gia_ManObj( p->pAig, iObj );
    Gia_Obj_t * pRepr = Gia_ObjReprObj( p->pAig, iObj );
    int fCompl = Abc_LitIsCompl(pObj->Value) ^ Abc_LitIsCompl(pRepr->Value) ^ pObj->fPhase ^ pRepr->fPhase;
    status = Cec2_ManSolveTwo( p, Abc_Lit2Var(pRepr->Value), Abc_Lit2Var(pObj->Value), fCompl );
    if ( status == SATOKO_SAT )
    {
        p->nSatSat++;
        p->nPatterns++;
        p->pAig->iPatsPi = (p->pAig->iPatsPi == 64 * p->pAig->nSimWords - 1) ? 1 : p->pAig->iPatsPi + 1;
        assert( p->pAig->iPatsPi > 0 && p->pAig->iPatsPi < 64 * p->pAig->nSimWords );
        Vec_IntForEachEntryDouble( p->vObjSatPairs, IdAig, IdSat, i )
            Cec2_ObjSimSetInputBit( p->pAig, IdAig, satoko_var_polarity(p->pSat, IdSat) == SATOKO_LIT_TRUE );
        p->timeSatSat += Abc_Clock() - clk;
        RetValue = 0;
    }
    else if ( status == SATOKO_UNSAT )
    {
        p->nSatUnsat++;
        pObj->Value = Abc_LitNotCond( pRepr->Value, fCompl );
        Gia_ObjSetProved( p->pAig, iObj );
        p->timeSatUnsat += Abc_Clock() - clk;
        RetValue = 1;
    }
    else 
    {
        p->nSatUndec++;
        assert( status == SATOKO_UNDEC );
        Gia_ObjSetFailed( p->pAig, iObj );
        p->timeSatUndec += Abc_Clock() - clk;
        RetValue = 2;
    }
    if ( p->pPars->fUseCones )
        return RetValue;
    clk = Abc_Clock();
    satoko_rollback( p->pSat );
    p->timeExtra += Abc_Clock() - clk;
    satoko_stats(p->pSat)->n_conflicts = 0;
    return RetValue;
}